

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *__s;
  bool bVar3;
  CommandOptions local_130 [2];
  FileReaderFactory local_c8 [8];
  FileReaderFactory defaultFactory;
  undefined1 local_b0 [8];
  CommandOptions Options;
  Result_t result;
  char **argv_local;
  int argc_local;
  
  Kumu::Result_t::Result_t((Result_t *)&Options.max_bitrate,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions((CommandOptions *)local_b0,argc,argv);
  if ((local_b0[1] & 1U) != 0) {
    banner(_stdout);
  }
  if ((local_b0[2] & 1U) != 0) {
    usage(_stdout);
  }
  if (((local_b0[1] & 1U) == 0) && ((local_b0[2] & 1U) == 0)) {
    if ((local_b0[0] & 1U) == 0) {
      init_rate_info();
      Kumu::FileReaderFactory::FileReaderFactory(local_c8);
      while( true ) {
        bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&Options);
        bVar3 = false;
        if (!bVar1) {
          iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Options.max_bitrate);
          bVar3 = -1 < iVar2;
        }
        if (!bVar3) break;
        show_file_info(local_130,(IFileReaderFactory *)local_b0);
        Kumu::Result_t::operator=((Result_t *)&Options.max_bitrate,(Result_t *)local_130);
        Kumu::Result_t::~Result_t((Result_t *)local_130);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&Options);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Options.max_bitrate);
      if (iVar2 < 0) {
        fputs("Program stopped on error.\n",_stderr);
        bVar3 = Kumu::Result_t::operator!=
                          ((Result_t *)&Options.max_bitrate,(Result_t *)Kumu::RESULT_FAIL);
        if (bVar3) {
          __s = Kumu::Result_t::operator_cast_to_char_((Result_t *)&Options.max_bitrate);
          fputs(__s,_stderr);
          fputc(10,_stderr);
        }
        argv_local._4_4_ = 1;
      }
      else {
        argv_local._4_4_ = 0;
      }
      _defaultFactory = 1;
      Kumu::FileReaderFactory::~FileReaderFactory(local_c8);
    }
    else {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
      argv_local._4_4_ = 3;
      _defaultFactory = 1;
    }
  }
  else {
    argv_local._4_4_ = 0;
    _defaultFactory = 1;
  }
  CommandOptions::~CommandOptions((CommandOptions *)local_b0);
  Kumu::Result_t::~Result_t((Result_t *)&Options.max_bitrate);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  init_rate_info();
  Kumu::FileReaderFactory defaultFactory;
  while ( ! Options.filenames.empty() && ASDCP_SUCCESS(result) )
    {
      result = show_file_info(Options, defaultFactory);
      Options.filenames.pop_front();
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}